

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::pls_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,PlsRemap *var)

{
  PlsFormat PVar1;
  SPIRVariable *variable;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  char *local_1c0;
  char *local_1b8;
  string local_1b0 [32];
  string local_190 [32];
  undefined1 local_170 [192];
  uint *local_b0;
  size_t local_a8;
  size_t local_a0;
  uint local_98 [8];
  TypeID local_78;
  undefined8 local_60;
  __node_base_ptr *local_58;
  size_type local_50;
  __node_base local_48;
  size_type sStack_40;
  float local_38;
  size_t local_30;
  __node_base_ptr p_Stack_28;
  
  variable = Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,var->id);
  local_170._32_8_ = local_170 + 0x38;
  local_170._0_8_ = &PTR__SPIRType_003a6498;
  local_170._24_4_ = 1;
  local_170._40_8_ = 0;
  local_170._48_8_ = 8;
  local_170._88_8_ = local_170 + 0x70;
  local_170._96_8_ = 0;
  local_170._104_8_ = 8;
  local_170._120_4_ = 0;
  local_170[0x7c] = false;
  local_170[0x7d] = false;
  local_170._128_4_ = StorageClassGeneric;
  local_170._136_8_ = local_170 + 0xa0;
  local_170._144_8_ = 0;
  local_170._152_8_ = 8;
  local_b0 = local_98;
  local_a8 = 0;
  local_a0 = 8;
  local_78.id = 0;
  local_60._0_4_ = 0;
  local_60._4_4_ = 0;
  local_58 = &p_Stack_28;
  local_50 = 1;
  local_48._M_nxt = (_Hash_node_base *)0x0;
  sStack_40 = 0;
  local_38 = 1.0;
  local_30 = 0;
  p_Stack_28 = (__node_base_ptr)0x0;
  PVar1 = var->format;
  uVar2 = 1;
  if (PVar1 < PlsR32UI) {
    if ((0x6b0U >> (PVar1 & 0x1f) & 1) == 0) {
      if ((0x948U >> (PVar1 & 0x1f) & 1) == 0) {
        if (PVar1 == PlsR11FG11FB10F) {
          local_170._16_8_ = 0x300000000;
          local_170._8_8_ = 0xd00000000;
          local_1b8 = "layout(r11f_g11f_b10f) ";
          goto LAB_00211436;
        }
      }
      else {
        uVar2 = 2;
      }
    }
    else {
      uVar2 = 4;
    }
  }
  local_170._16_8_ = (ulong)uVar2 << 0x20;
  if (PVar1 - PlsRGBA8I < 6) {
    uVar2 = *(uint *)(&DAT_00304444 + (ulong)(PVar1 - PlsRGBA8I) * 4);
  }
  else {
    uVar2 = 0xd;
  }
  local_170._8_8_ = (ulong)uVar2 << 0x20;
  if (PVar1 - PlsR11FG11FB10F < 0xc) {
    local_1b8 = &DAT_0030445c + *(int *)(&DAT_0030445c + (ulong)(PVar1 - PlsR11FG11FB10F) * 4);
  }
  else {
    local_1b8 = "";
  }
LAB_00211436:
  local_1c0 = to_pls_qualifiers_glsl(this,variable);
  (*(this->super_Compiler)._vptr_Compiler[0x13])(local_190,this,local_170,0);
  (*(this->super_Compiler)._vptr_Compiler[6])
            (local_1b0,this,(ulong)(variable->super_IVariant).self.id,1);
  join<char_const*,char_const*,std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)&local_1b8,&local_1c0,(char **)local_190,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30b65a,
             (char (*) [2])local_1b0,in_stack_fffffffffffffe38);
  ::std::__cxx11::string::~string(local_1b0);
  ::std::__cxx11::string::~string(local_190);
  SPIRType::~SPIRType((SPIRType *)local_170);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::pls_decl(const PlsRemap &var)
{
	auto &variable = get<SPIRVariable>(var.id);

	SPIRType type;
	type.vecsize = pls_format_to_components(var.format);
	type.basetype = pls_format_to_basetype(var.format);

	return join(to_pls_layout(var.format), to_pls_qualifiers_glsl(variable), type_to_glsl(type), " ",
	            to_name(variable.self));
}